

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O0

int md_line_contains(MD_CTX *ctx,MD_OFFSET beg,MD_CHAR *what,MD_SIZE what_len,MD_OFFSET *p_end)

{
  int iVar1;
  uint in_ECX;
  void *in_RDX;
  uint in_ESI;
  long *in_RDI;
  uint *in_R8;
  MD_OFFSET i;
  uint local_34;
  
  for (local_34 = in_ESI;
      ((local_34 + in_ECX < *(uint *)(in_RDI + 1) && (*(char *)(*in_RDI + (ulong)local_34) != '\r'))
      && (*(char *)(*in_RDI + (ulong)local_34) != '\n')); local_34 = local_34 + 1) {
    iVar1 = memcmp((void *)(*in_RDI + (ulong)local_34),in_RDX,(ulong)in_ECX);
    if (iVar1 == 0) {
      *in_R8 = local_34 + in_ECX;
      return 1;
    }
  }
  *in_R8 = local_34;
  return 0;
}

Assistant:

static int
md_line_contains(MD_CTX* ctx, OFF beg, const CHAR* what, SZ what_len, OFF* p_end)
{
    OFF i;
    for(i = beg; i + what_len < ctx->size; i++) {
        if(ISNEWLINE(i))
            break;
        if(memcmp(STR(i), what, what_len * sizeof(CHAR)) == 0) {
            *p_end = i + what_len;
            return TRUE;
        }
    }

    *p_end = i;
    return FALSE;
}